

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

bool cfd::core::ComparePsbtData
               (uint8_t *src,size_t src_len,uint8_t *dest,size_t dest_len,string *item_name,
               string *key,bool ignore_duplicate_error)

{
  int iVar1;
  CfdException *this;
  undefined1 local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (src_len == dest_len) {
    iVar1 = bcmp(src,dest,src_len);
    if (ignore_duplicate_error || iVar1 == 0) {
      return iVar1 == 0;
    }
  }
  else if (ignore_duplicate_error) {
    return false;
  }
  if (key->_M_string_length == 0) {
    local_58._0_8_ = "cfdcore_psbt.cpp";
    local_58._8_4_ = 0x132;
    local_58._16_8_ = "ComparePsbtData";
    logger::warn<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_58,"psbt {} already exist.",item_name);
  }
  else {
    local_58._0_8_ = "cfdcore_psbt.cpp";
    local_58._8_4_ = 0x134;
    local_58._16_8_ = "ComparePsbtData";
    logger::warn<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_58,"psbt {} already exist. key[{}]",item_name,key);
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+(&local_38,"psbt ",item_name);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_38," duplicated error.");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool ComparePsbtData(
    uint8_t *src, size_t src_len, const uint8_t *dest, size_t dest_len,
    const std::string &item_name, const std::string &key,
    bool ignore_duplicate_error) {
  bool is_compare = false;
  if ((src_len == dest_len) && (memcmp(src, dest, src_len) == 0)) {
    is_compare = true;
  } else if (ignore_duplicate_error) {
    // do nothing
  } else {
    if (key.empty()) {
      warn(CFD_LOG_SOURCE, "psbt {} already exist.", item_name);
    } else {
      warn(CFD_LOG_SOURCE, "psbt {} already exist. key[{}]", item_name, key);
    }
    throw CfdException(
        kCfdIllegalArgumentError, "psbt " + item_name + " duplicated error.");
  }
  return is_compare;
}